

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O2

int ffgpxvll(fitsfile *fptr,int datatype,LONGLONG *firstpix,LONGLONG nelem,void *nulval,void *array,
            int *anynul,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  LONGLONG *pLVar6;
  long *plVar7;
  LONGLONG *pLVar8;
  long *plVar9;
  float nulval_00;
  double nulval_01;
  char nulval_02;
  uchar nulval_03;
  short nulval_04;
  unsigned_short nulval_05;
  uint nulval_06;
  unsigned_long nulval_07;
  ULONGLONG nulval_08;
  LONGLONG nulval_09;
  char cdummy;
  double *local_130;
  LONGLONG local_128;
  int naxis;
  LONGLONG local_118;
  long local_110;
  long local_108;
  LONGLONG naxes [9];
  long inc [9];
  
  lVar4 = 9;
  pLVar6 = &DAT_001cc960;
  pLVar8 = &local_118;
  for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pLVar8 = *pLVar6;
    pLVar6 = pLVar6 + 1;
    pLVar8 = pLVar8 + 1;
  }
  plVar7 = &DAT_001cc960;
  plVar9 = inc;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar9 = *plVar7;
    plVar7 = plVar7 + 1;
    plVar9 = plVar9 + 1;
  }
  iVar1 = *status;
  if (nelem != 0 && iVar1 < 1) {
    local_130 = (double *)array;
    local_128 = nelem;
    ffgidm(fptr,&naxis,status);
    ffgiszll(fptr,9,naxes,status);
    if ((naxis == 0) || (naxes[0] == 0)) {
      *status = 0x140;
      iVar1 = 0x140;
    }
    else {
      uVar5 = 0;
      uVar2 = (ulong)(uint)naxis;
      if (naxis < 1) {
        uVar2 = uVar5;
      }
      lVar4 = 1;
      lVar3 = 0;
      for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        lVar3 = lVar3 + (firstpix[uVar5] + -1) * lVar4;
        lVar4 = lVar4 * naxes[uVar5];
        (&local_118)[uVar5] = firstpix[uVar5];
      }
      lVar3 = lVar3 + 1;
      iVar1 = fits_is_compressed_image(fptr,status);
      if (iVar1 == 0) {
        if (datatype == 0x52) {
          if (nulval == (void *)0x0) {
            nulval_01 = 0.0;
          }
          else {
            nulval_01 = *nulval;
          }
          ffgcld(fptr,2,1,lVar3,local_128,1,1,nulval_01,local_130,&cdummy,anynul,status);
        }
        else if (datatype == 0xc) {
          if (nulval == (void *)0x0) {
            nulval_02 = '\0';
          }
          else {
            nulval_02 = *nulval;
          }
          ffgclsb(fptr,2,1,lVar3,local_128,1,1,nulval_02,(char *)local_130,&cdummy,anynul,status);
        }
        else if (datatype == 0x14) {
          if (nulval == (void *)0x0) {
            nulval_05 = 0;
          }
          else {
            nulval_05 = *nulval;
          }
          ffgclui(fptr,2,1,lVar3,local_128,1,1,nulval_05,(unsigned_short *)local_130,&cdummy,anynul,
                  status);
        }
        else if (datatype == 0x15) {
          if (nulval == (void *)0x0) {
            nulval_04 = 0;
          }
          else {
            nulval_04 = *nulval;
          }
          ffgcli(fptr,2,1,lVar3,local_128,1,1,nulval_04,(short *)local_130,&cdummy,anynul,status);
        }
        else if (datatype == 0x1e) {
          if (nulval == (void *)0x0) {
            nulval_06 = 0;
          }
          else {
            nulval_06 = *nulval;
          }
          ffgcluk(fptr,2,1,lVar3,local_128,1,1,nulval_06,(uint *)local_130,&cdummy,anynul,status);
        }
        else if (datatype == 0x1f) {
          if (nulval == (void *)0x0) {
            iVar1 = 0;
          }
          else {
            iVar1 = *nulval;
          }
          ffgclk(fptr,2,1,lVar3,local_128,1,1,iVar1,(int *)local_130,&cdummy,anynul,status);
        }
        else if (datatype == 0x28) {
          if (nulval == (void *)0x0) {
            nulval_07 = 0;
          }
          else {
            nulval_07 = *nulval;
          }
          ffgcluj(fptr,2,1,lVar3,local_128,1,1,nulval_07,(unsigned_long *)local_130,&cdummy,anynul,
                  status);
        }
        else if (datatype == 0x29) {
          if (nulval == (void *)0x0) {
            lVar4 = 0;
          }
          else {
            lVar4 = *nulval;
          }
          ffgclj(fptr,2,1,lVar3,local_128,1,1,lVar4,(long *)local_130,&cdummy,anynul,status);
        }
        else if (datatype == 0x2a) {
          if (nulval == (void *)0x0) {
            nulval_00 = 0.0;
          }
          else {
            nulval_00 = *nulval;
          }
          ffgcle(fptr,2,1,lVar3,local_128,1,1,nulval_00,(float *)local_130,&cdummy,anynul,status);
        }
        else if (datatype == 0x50) {
          if (nulval == (void *)0x0) {
            nulval_08 = 0;
          }
          else {
            nulval_08 = *nulval;
          }
          ffgclujj(fptr,2,1,lVar3,local_128,1,1,nulval_08,(ULONGLONG *)local_130,&cdummy,anynul,
                   status);
        }
        else if (datatype == 0x51) {
          if (nulval == (void *)0x0) {
            nulval_09 = 0;
          }
          else {
            nulval_09 = *nulval;
          }
          ffgcljj(fptr,2,1,lVar3,local_128,1,1,nulval_09,(LONGLONG *)local_130,&cdummy,anynul,status
                 );
        }
        else if (datatype == 0xb) {
          if (nulval == (void *)0x0) {
            nulval_03 = '\0';
          }
          else {
            nulval_03 = *nulval;
          }
          ffgclb(fptr,2,1,lVar3,local_128,1,1,nulval_03,(uchar *)local_130,&cdummy,anynul,status);
        }
        else {
          *status = 0x19a;
        }
        iVar1 = *status;
      }
      else {
        if ((((naxis & 0xfffffffeU) == 2) && (*firstpix == 1)) && (local_128 % naxes[0] == 0)) {
          local_118 = naxes[0];
          local_110 = firstpix[1] + local_128 / naxes[0] + -1;
          while (local_110 - naxes[1] != 0 && naxes[1] <= local_110) {
            local_108 = local_108 + 1;
            local_110 = local_110 - naxes[1];
          }
          fits_read_compressed_img
                    (fptr,datatype,firstpix,&local_118,inc,1,nulval,local_130,(char *)0x0,anynul,
                     status);
        }
        else {
          fits_read_compressed_pixels
                    (fptr,datatype,lVar3,local_128,1,nulval,local_130,(char *)0x0,anynul,status);
        }
        iVar1 = *status;
      }
    }
  }
  return iVar1;
}

Assistant:

int ffgpxvll( fitsfile *fptr, /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG *firstpix, /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,   /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    char cdummy;
    int nullcheck = 1;
    LONGLONG naxes[9], trc[9]= {1,1,1,1,1,1,1,1,1};
    long inc[9]= {1,1,1,1,1,1,1,1,1};
    LONGLONG dimsize = 1, firstelem;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);

    ffgiszll(fptr, 9, naxes, status);

    if (naxis == 0 || naxes[0] == 0) {
       *status = BAD_DIMEN;
       return(*status);
    }

    /* calculate the position of the first element in the array */
    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
        trc[ii] = firstpix[ii];
    }
    firstelem++;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        /* test for special case of reading an integral number of */
        /* rows in a 2D or 3D image (which includes reading the whole image */

	if (naxis > 1 && naxis < 4 && firstpix[0] == 1 &&
            (nelem / naxes[0]) * naxes[0] == nelem) {

                /* calculate coordinate of last pixel */
		trc[0] = naxes[0];  /* reading whole rows */
		trc[1] = firstpix[1] + (nelem / naxes[0] - 1);
                while (trc[1] > naxes[1])  {
		    trc[1] = trc[1] - naxes[1];
		    trc[2] = trc[2] + 1;  /* increment to next plane of cube */
                }

                fits_read_compressed_img(fptr, datatype, firstpix, trc, inc,
                   1, nulval, array, NULL, anynul, status);

        } else {

                fits_read_compressed_pixels(fptr, datatype, firstelem,
                   nelem, nullcheck, nulval, array, NULL, anynul, status);
        }

        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned char *) array, &cdummy, anynul, status);
      else
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned char *) nulval,
               (unsigned char *) array, &cdummy, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (signed char *) array, &cdummy, anynul, status);
      else
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 1, *(signed char *) nulval,
               (signed char *) array, &cdummy, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned short *) array, &cdummy, anynul, status);
      else
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned short *) nulval,
               (unsigned short *) array, &cdummy, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (short *) array, &cdummy, anynul, status);
      else
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 1, *(short *) nulval,
               (short *) array, &cdummy, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned int *) array, &cdummy, anynul, status);
      else
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned int *) nulval,
               (unsigned int *) array, &cdummy, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (int *) array, &cdummy, anynul, status);
      else
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 1, *(int *) nulval,
               (int *) array, &cdummy, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned long *) array, &cdummy, anynul, status);
      else
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned long *) nulval,
               (unsigned long *) array, &cdummy, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (long *) array, &cdummy, anynul, status);
      else
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 1, *(long *) nulval,
               (long *) array, &cdummy, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (ULONGLONG *) array, &cdummy, anynul, status);
      else
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 1, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, &cdummy, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (LONGLONG *) array, &cdummy, anynul, status);
      else
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 1, *(LONGLONG *) nulval,
               (LONGLONG *) array, &cdummy, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (float *) array, &cdummy, anynul, status);
      else
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 1, *(float *) nulval,
               (float *) array, &cdummy, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (double *) array, &cdummy, anynul, status);
      else
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 1, *(double *) nulval,
               (double *) array, &cdummy, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}